

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::property::property
          (property *this,text_input_buffer *input,string *k,string_set *l,bool semicolonTerminated,
          define_map *defines)

{
  bool *pbVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  char *msg;
  string local_f0;
  string filename;
  source_location loc;
  unsigned_long_long bits;
  byte_buffer local_50;
  
  std::__cxx11::string::string((string *)this,(string *)k);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->labels)._M_h,&l->_M_h);
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->valid = true;
  do {
    text_input_buffer::next_token(input);
    cVar3 = text_input_buffer::operator*(input);
    if (cVar3 == '\"') {
      parse_string(this,input);
    }
    else if (cVar3 == '$') {
      parse_define(this,input,defines);
      if (this->valid == false) {
LAB_0012cd49:
        text_input_buffer::parse_error(input,"Invalid property value.");
        goto LAB_0012cd58;
      }
    }
    else if (cVar3 == '&') {
      parse_reference(this,input);
    }
    else if (cVar3 == '/') {
      bVar4 = text_input_buffer::consume(input,"/incbin/(\"");
      if (bVar4) {
        text_input_buffer::source_location::source_location(&loc,input);
        text_input_buffer::parse_to_abi_cxx11_(&filename,input,'\"');
        bVar4 = text_input_buffer::consume(input,'\"');
        this->valid = bVar4;
        if (!bVar4) {
          text_input_buffer::source_location::report_error
                    (&loc,"Syntax error, expected \'\"\' to terminate /incbin/(");
          goto LAB_0012cda7;
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        property_value::property_value((property_value *)&bits,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        bVar4 = text_input_buffer::read_binary_file(input,&filename,&local_50);
        this->valid = bVar4;
        if (bVar4) {
          bVar4 = text_input_buffer::consume(input,')');
          pbVar1 = &this->valid;
          *pbVar1 = (bool)(*pbVar1 & bVar4);
          if (*pbVar1 != false) {
            std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
            push_back(&this->values,(property_value *)&bits);
            property_value::~property_value((property_value *)&bits);
            std::__cxx11::string::~string((string *)&filename);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loc.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_0012ccff;
          }
          msg = "Syntax error, expected \')\' to terminate /incbin/(";
        }
        else {
          msg = "Cannot open binary include file";
        }
        text_input_buffer::parse_error(input,msg);
        property_value::~property_value((property_value *)&bits);
LAB_0012cda7:
        std::__cxx11::string::~string((string *)&filename);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&loc.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
      bits = 0;
      bVar4 = text_input_buffer::consume(input,"/bits/");
      this->valid = bVar4;
      text_input_buffer::next_token(input);
      bVar4 = text_input_buffer::consume_integer(input,&bits);
      bVar4 = (bool)(bVar4 & this->valid);
      this->valid = bVar4;
      uVar2 = bits - 8 >> 3;
      if ((7 < (bits << 0x3d | uVar2)) || ((0x8bUL >> (uVar2 & 0x3f) & 1) == 0)) {
        text_input_buffer::parse_error(input,"Invalid size for elements");
        goto LAB_0012cd58;
      }
      if (bVar4 == false) {
        return;
      }
      text_input_buffer::next_token(input);
      cVar3 = text_input_buffer::operator*(input);
      if (cVar3 != '<') {
        text_input_buffer::parse_error(input,"/bits/ directive is only valid on arrays");
        goto LAB_0012cd58;
      }
      parse_cells(this,input,(int)bits);
    }
    else if (cVar3 != ';') {
      if (cVar3 == '<') {
        parse_cells(this,input,0x20);
      }
      else {
        if (cVar3 != '[') goto LAB_0012cd49;
        parse_bytes(this,input);
      }
    }
LAB_0012ccff:
    text_input_buffer::next_token(input);
    bVar4 = text_input_buffer::consume(input,',');
    if (!bVar4) {
      if ((semicolonTerminated) && (bVar4 = text_input_buffer::consume(input,';'), !bVar4)) {
        text_input_buffer::parse_error(input,"Expected ; at end of property");
LAB_0012cd58:
        this->valid = false;
      }
      return;
    }
  } while( true );
}

Assistant:

property::property(text_input_buffer &input,
                   string &&k,
                   string_set &&l,
                   bool semicolonTerminated,
                   define_map *defines) : key(k), labels(l), valid(true)
{
	do {
		input.next_token();
		switch (*input)
		{
			case '$':
			{
				parse_define(input, defines);
				if (valid)
				{
					break;
				}
			}
			[[fallthrough]];
			default:
				input.parse_error("Invalid property value.");
				valid = false;
				return;
			case '/':
			{
				if (input.consume("/incbin/(\""))
				{
					auto loc = input.location();
					std::string filename = input.parse_to('"');
					if (!(valid = input.consume('"')))
					{
						loc.report_error("Syntax error, expected '\"' to terminate /incbin/(");
						return;
					}
					property_value v;
					if (!(valid = input.read_binary_file(filename, v.byte_data)))
					{
						input.parse_error("Cannot open binary include file");
						return;
					}
					if (!(valid &= input.consume(')')))
					{
						input.parse_error("Syntax error, expected ')' to terminate /incbin/(");
						return;
					}
					values.push_back(v);
					break;
				}
				unsigned long long bits = 0;
				valid = input.consume("/bits/");
				input.next_token();
				valid &= input.consume_integer(bits);
				if ((bits != 8) &&
				    (bits != 16) &&
				    (bits != 32) &&
				    (bits != 64)) {
					input.parse_error("Invalid size for elements");
					valid = false;
				}
				if (!valid) return;
				input.next_token();
				if (*input != '<')
				{
					input.parse_error("/bits/ directive is only valid on arrays");
					valid = false;
					return;
				}
				parse_cells(input, bits);
				break;
			}
			case '"':
				parse_string(input);
				break;
			case '<':
				parse_cells(input, 32);
				break;
			case '[':
				parse_bytes(input);
				break;
			case '&':
				parse_reference(input);
				break;
			case ';':
			{
				break;
			}
		}
		input.next_token();
	} while (input.consume(','));
	if (semicolonTerminated && !input.consume(';'))
	{
		input.parse_error("Expected ; at end of property");
		valid = false;
	}
}